

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::ZoneBitVector::_append(ZoneBitVector *this,ZoneAllocator *allocator,bool value)

{
  uint uVar1;
  uint uVar2;
  long in_RDI;
  uint32_t idealCapacity;
  uint32_t newSize;
  uint32_t kThreshold;
  bool in_stack_00000037;
  uint32_t in_stack_00000038;
  uint32_t in_stack_0000003c;
  ZoneAllocator *in_stack_00000040;
  ZoneBitVector *in_stack_00000048;
  uint local_28;
  Error local_4;
  
  local_28 = *(uint *)(in_RDI + 0xc);
  if (local_28 < 0x80) {
    local_28 = 0x80;
  }
  else if (local_28 < 0x8000001) {
    local_28 = local_28 << 1;
  }
  else {
    local_28 = local_28 + 0x8000000;
  }
  if ((local_28 < *(uint *)(in_RDI + 0xc)) &&
     (uVar1 = *(uint *)(in_RDI + 8), uVar2 = std::numeric_limits<unsigned_int>::max(),
     uVar1 == uVar2)) {
    local_4 = DebugUtils::errored(1);
  }
  else {
    local_4 = _resize(in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000038,
                      in_stack_00000037);
  }
  return local_4;
}

Assistant:

Error ZoneBitVector::_append(ZoneAllocator* allocator, bool value) noexcept {
  uint32_t kThreshold = Globals::kGrowThreshold * 8;
  uint32_t newSize = _size + 1;
  uint32_t idealCapacity = _capacity;

  if (idealCapacity < 128)
    idealCapacity = 128;
  else if (idealCapacity <= kThreshold)
    idealCapacity *= 2;
  else
    idealCapacity += kThreshold;

  if (ASMJIT_UNLIKELY(idealCapacity < _capacity)) {
    if (ASMJIT_UNLIKELY(_size == std::numeric_limits<uint32_t>::max()))
      return DebugUtils::errored(kErrorOutOfMemory);
    idealCapacity = newSize;
  }

  return _resize(allocator, newSize, idealCapacity, value);
}